

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O0

int Sat_MemAppend(Sat_Mem_t *p,int *pArray,int nSize,int lrn,int fPlus1)

{
  int nInts_00;
  int iVar1;
  cla cVar2;
  int *piVar3;
  uint *puVar4;
  int **local_48;
  int *piStack_38;
  int nInts;
  int *pPage;
  clause *c;
  int fPlus1_local;
  int lrn_local;
  int nSize_local;
  int *pArray_local;
  Sat_Mem_t *p_local;
  
  piStack_38 = p->pPages[p->iPage[lrn]];
  nInts_00 = Sat_MemIntSize(nSize,lrn | fPlus1);
  if (nInts_00 + 3 < 1 << ((byte)p->nPageSize & 0x1f)) {
    iVar1 = Sat_MemLimit(piStack_38);
    if (1 << ((byte)p->nPageSize & 0x1f) <= iVar1 + nInts_00 + 2) {
      p->iPage[lrn] = p->iPage[lrn] + 2;
      if (p->nPagesAlloc <= p->iPage[lrn]) {
        if (p->pPages == (int **)0x0) {
          local_48 = (int **)malloc((long)(p->nPagesAlloc << 1) << 3);
        }
        else {
          local_48 = (int **)realloc(p->pPages,(long)(p->nPagesAlloc << 1) << 3);
        }
        p->pPages = local_48;
        memset(p->pPages + p->nPagesAlloc,0,(long)p->nPagesAlloc << 3);
        p->nPagesAlloc = p->nPagesAlloc << 1;
      }
      if (p->pPages[p->iPage[lrn]] == (int *)0x0) {
        piVar3 = (int *)malloc((long)(1 << ((byte)p->nPageSize & 0x1f)) << 2);
        p->pPages[p->iPage[lrn]] = piVar3;
      }
      piStack_38 = p->pPages[p->iPage[lrn]];
      Sat_MemWriteLimit(piStack_38,2);
    }
    iVar1 = Sat_MemLimit(piStack_38);
    piStack_38[iVar1] = 0;
    iVar1 = Sat_MemLimit(piStack_38);
    puVar4 = (uint *)(piStack_38 + iVar1);
    *puVar4 = *puVar4 & 0x7ff | nSize << 0xb;
    *puVar4 = *puVar4 & 0xfffffffe | lrn & 1U;
    if (pArray != (int *)0x0) {
      memcpy(puVar4 + 1,pArray,(long)nSize << 2);
    }
    if (lrn != 0 || fPlus1 != 0) {
      puVar4[(ulong)(*puVar4 >> 0xb) + 1] = p->nEntries[lrn];
    }
    p->nEntries[lrn] = p->nEntries[lrn] + 1;
    Sat_MemIncLimit(piStack_38,nInts_00);
    cVar2 = Sat_MemHandCurrent(p,lrn);
    return cVar2 - nInts_00;
  }
  __assert_fail("nInts + 3 < (1 << p->nPageSize)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                ,0x132,"int Sat_MemAppend(Sat_Mem_t *, int *, int, int, int)");
}

Assistant:

static inline int Sat_MemAppend( Sat_Mem_t * p, int * pArray, int nSize, int lrn, int fPlus1 )
{
    clause * c;
    int * pPage = p->pPages[p->iPage[lrn]];
    int nInts = Sat_MemIntSize( nSize, lrn | fPlus1 );
    assert( nInts + 3 < (1 << p->nPageSize) );
    // need two extra at the begining of the page and one extra in the end
    if ( Sat_MemLimit(pPage) + nInts + 2 >= (1 << p->nPageSize) )
    { 
        p->iPage[lrn] += 2;
        if ( p->iPage[lrn] >= p->nPagesAlloc )
        {
            p->pPages = ABC_REALLOC( int *, p->pPages, p->nPagesAlloc * 2 );
            memset( p->pPages + p->nPagesAlloc, 0, sizeof(int *) * p->nPagesAlloc );
            p->nPagesAlloc *= 2;
        }
        if ( p->pPages[p->iPage[lrn]] == NULL )
            p->pPages[p->iPage[lrn]] = ABC_ALLOC( int, (1 << p->nPageSize) );
        pPage = p->pPages[p->iPage[lrn]];
        Sat_MemWriteLimit( pPage, 2 );
    }
    pPage[Sat_MemLimit(pPage)] = 0;
    c = (clause *)(pPage + Sat_MemLimit(pPage));
    c->size = nSize;
    c->lrn = lrn;
    if ( pArray )
        memcpy( c->lits, pArray, sizeof(int) * nSize );
    if ( lrn | fPlus1 )
        c->lits[c->size] = p->nEntries[lrn];
    p->nEntries[lrn]++;
    Sat_MemIncLimit( pPage, nInts );
    return Sat_MemHandCurrent(p, lrn) - nInts;
}